

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_DeleteProperty
              (Var instance,PropertyId propertyId,ScriptContext *scriptContext,
              PropertyOperationFlags propertyOperationFlags)

{
  JavascriptLibrary *this;
  bool bVar1;
  int value;
  RecyclableObject *pRVar2;
  JavascriptBoolean *pJVar3;
  PropertyRecord *pPVar4;
  
  bVar1 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar1) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).booleanTrue.ptr;
  }
  pRVar2 = VarTo<Js::RecyclableObject>(instance);
  if (1 < (int)((pRVar2->type).ptr)->typeId) {
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    value = (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x21])
                      (pRVar2,(ulong)(uint)propertyId,(ulong)propertyOperationFlags);
    pJVar3 = JavascriptLibrary::CreateBoolean(this,value);
    return pJVar3;
  }
  pPVar4 = ScriptContext::GetPropertyName(scriptContext,propertyId);
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec47,(PCWSTR)(pPVar4 + 1));
}

Assistant:

Var JavascriptOperators::OP_DeleteProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteProperty);
        if(TaggedNumber::Is(instance))
        {
            return scriptContext->GetLibrary()->GetTrue();
        }

        RecyclableObject* recyclableObject = VarTo<RecyclableObject>(instance);
        if (JavascriptOperators::IsUndefinedOrNull(recyclableObject))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotDelete_NullOrUndefined,
                scriptContext->GetPropertyName(propertyId)->GetBuffer());
        }

        return scriptContext->GetLibrary()->CreateBoolean(
            JavascriptOperators::DeleteProperty(recyclableObject, propertyId, propertyOperationFlags));
        JIT_HELPER_END(Op_DeleteProperty);
    }